

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O1

size_t __thiscall TokenStream::TextStream::offset_for_line(TextStream *this,size_t lineno)

{
  pointer puVar1;
  logic_error *this_00;
  
  puVar1 = (this->line_offset).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (lineno - 1 <
      (ulong)((long)(this->line_offset).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    return puVar1[lineno - 1];
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bad `lineno` in TokenStream::offset_for_line");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

size_t TokenStream::TextStream::offset_for_line(size_t lineno) const
{
    size_t i = (lineno - 1);
    if(i < line_offset.size())
        return line_offset[i];
    else
        throw std::logic_error("bad `lineno` in TokenStream::offset_for_line");
}